

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O1

SemaphoreStatus ot::os::semaphore::SemaphoreOpen(string *aName,Semaphore *aSem)

{
  sem_t *psVar1;
  string semName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"/",aName);
  aSem->mPlatform = (sem_t *)0x0;
  psVar1 = sem_open(local_38._M_dataplus._M_p,0x40,0x180,1);
  aSem->mPlatform = (sem_t *)psVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (SemaphoreStatus)(psVar1 == (sem_t *)0x0);
}

Assistant:

SemaphoreStatus SemaphoreOpen(std::string const &aName, Semaphore &aSem)
{
    std::string semName = "/" + aName;
    aSem.mPlatform      = nullptr;

    aSem.mPlatform = sem_open(semName.c_str(), O_CREAT, S_IWUSR | S_IRUSR, 1);
    if (aSem.mPlatform == SEM_FAILED)
    {
        return kError;
    }

    return kSuccess;
}